

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

TTDVar TTD::NSSnapValues::ParseTTDVar(bool readSeparator,FileReader *reader)

{
  TTDVarEmitTag TVar1;
  uint uVar2;
  Var pvVar3;
  undefined7 in_register_00000039;
  double value;
  
  (*reader->_vptr_FileReader[6])(reader,CONCAT71(in_register_00000039,readSeparator) & 0xffffffff);
  TVar1 = FileReader::ReadTag<TTD::NSSnapValues::TTDVarEmitTag>(reader,ttdVarTag,false);
  switch(TVar1) {
  case TTDVarNull:
    FileReader::ReadNull(reader,nullVal,true);
    pvVar3 = (Var)0x0;
    break;
  case TTDVarInt:
    uVar2 = FileReader::ReadInt32(reader,i32Val,true);
    pvVar3 = (Var)((ulong)uVar2 | 0x1000000000000);
    break;
  case TTDVarDouble:
    value = FileReader::ReadDouble(reader,doubleVal,true);
    pvVar3 = Js::JavascriptNumber::ToVar(value);
    break;
  case TTDVarAddr:
    pvVar3 = (Var)FileReader::ReadAddr(reader,ptrIdVal,true);
    break;
  default:
    TTDAbort_unrecoverable_error("Is there something else?");
  }
  (*reader->_vptr_FileReader[7])(reader);
  return pvVar3;
}

Assistant:

TTDVar ParseTTDVar(bool readSeparator, FileReader* reader)
        {
            reader->ReadRecordStart(readSeparator);

            TTDVar res = nullptr;
            TTDVarEmitTag tag = reader->ReadTag<TTDVarEmitTag>(NSTokens::Key::ttdVarTag);
            if(tag == TTDVarEmitTag::TTDVarNull)
            {
                reader->ReadNull(NSTokens::Key::nullVal, true);
                res = nullptr;
            }
            else if(tag == TTDVarEmitTag::TTDVarInt)
            {
                int32 intVal = reader->ReadInt32(NSTokens::Key::i32Val, true);
                res = Js::TaggedInt::ToVarUnchecked(intVal);
            }
#if FLOATVAR
            else if(tag == TTDVarEmitTag::TTDVarDouble)
            {
                double doubleVal = reader->ReadDouble(NSTokens::Key::doubleVal, true);
                res = Js::JavascriptNumber::NewInlined(doubleVal, nullptr);
            }
#endif
            else
            {
                TTDAssert(tag == TTDVarEmitTag::TTDVarAddr, "Is there something else?");

                TTD_PTR_ID addrVal = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);
                res = TTD_COERCE_PTR_ID_TO_VAR(addrVal);
            }